

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O1

void __thiscall
so_5::disp::reuse::work_thread::details::
common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
::common_data_t(common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                *this,lock_factory_t *queue_lock_factory)

{
  long *in_RAX;
  pointer *__ptr;
  lock_unique_ptr_t local_18;
  
  (this->m_thread)._M_id._M_thread = 0;
  (this->m_status)._M_i = stopped;
  if ((queue_lock_factory->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_18._M_t.
    super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
    .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
         (__uniq_ptr_data<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>,_true,_true>
            )in_RAX;
    (*queue_lock_factory->_M_invoker)((_Any_data *)&local_18);
    demand_queue_details::
    queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
    ::queue_template_t(&this->m_queue,&local_18);
    if (local_18._M_t.
        super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
        ._M_t.
        super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
        .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
         )0x0) {
      (**(code **)(*(long *)local_18._M_t.
                            super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
                            .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>.
                            _M_head_impl + 8))();
    }
    (this->m_thread_id)._M_thread = 0;
    (this->m_demands_count).super___atomic_base<unsigned_long>._M_i = 0;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

common_data_t(
		queue_traits::lock_factory_t queue_lock_factory )
		:	m_queue( queue_lock_factory() )
	{}